

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O3

void apply_imputation_results<std::vector<ImputedData<int,double>,std::allocator<ImputedData<int,double>>>,InputData<double,int>>
               (vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>
                *impute_vec,Imputer *imputer,InputData<double,_int> *input_data,int nthreads)

{
  pointer pIVar1;
  int iVar2;
  int *piVar3;
  pointer pIVar4;
  pointer pdVar5;
  unsigned_long uVar6;
  pointer pcVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  pointer piVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  int iVar15;
  double *pdVar16;
  ulong uVar17;
  double *pdVar18;
  size_t sVar19;
  size_t sVar20;
  size_t sVar21;
  long lVar22;
  double dVar23;
  double dVar24;
  vector<unsigned_long,_std::allocator<unsigned_long>_> row_pos;
  allocator_type local_79;
  InputData<double,_int> *local_78;
  int *local_70;
  Imputer *local_68;
  vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_> *local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  value_type_conflict1 local_38;
  
  local_78 = input_data;
  local_68 = imputer;
  local_60 = impute_vec;
  if (input_data->Xc_indptr != (int *)0x0) {
    local_38 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_50,input_data->nrows,&local_38,&local_79);
    sVar20 = input_data->ncols_numeric;
    if (sVar20 != 0) {
      pdVar18 = input_data->Xc;
      local_70 = input_data->Xc_indptr;
      uVar17 = 0;
      iVar15 = *local_70;
      do {
        iVar2 = local_70[uVar17 + 1];
        if (iVar15 < iVar2) {
          piVar3 = input_data->Xc_ind;
          pIVar4 = (local_60->
                   super__Vector_base<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pdVar5 = (local_68->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          lVar22 = (long)iVar15;
          do {
            if (0x7fefffffffffffff < (ulong)ABS(pdVar18[lVar22])) {
              iVar15 = piVar3[lVar22];
              uVar6 = local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[iVar15];
              dVar24 = *(double *)
                        (*(long *)&pIVar4[iVar15].sp_num_weight.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data + uVar6 * 8);
              if ((dVar24 <= 0.0) ||
                 (dVar23 = *(double *)
                            (*(long *)&pIVar4[iVar15].sp_num_sum.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + uVar6 * 8),
                 0x7fefffffffffffff < (ulong)ABS(dVar23))) {
                dVar23 = pdVar5[uVar17];
              }
              else {
                dVar23 = dVar23 / dVar24;
              }
              pdVar18[lVar22] = dVar23;
              local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[iVar15] = uVar6 + 1;
            }
            lVar22 = lVar22 + 1;
          } while (iVar2 != lVar22);
          sVar20 = local_78->ncols_numeric;
          input_data = local_78;
        }
        uVar17 = uVar17 + 1;
        iVar15 = iVar2;
      } while (uVar17 < sVar20);
    }
    if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_50.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  sVar20 = input_data->nrows;
  if (sVar20 != 0) {
    piVar3 = local_78->categ_data;
    pcVar7 = (local_78->has_missing).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pIVar4 = (local_60->
             super__Vector_base<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    sVar19 = 0;
    do {
      if (pcVar7[sVar19] != '\0') {
        pIVar1 = pIVar4 + sVar19;
        sVar8 = pIVar4[sVar19].n_missing_num;
        if (sVar8 != 0) {
          lVar22 = *(long *)&(pIVar1->num_weight).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data;
          lVar9 = *(long *)&(pIVar1->missing_num).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data;
          pdVar18 = local_78->numeric_data;
          pdVar5 = (local_68->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          sVar21 = 0;
          do {
            lVar10 = *(long *)(lVar9 + sVar21 * 8);
            dVar24 = *(double *)(lVar22 + sVar21 * 8);
            if ((dVar24 <= 0.0) ||
               (dVar23 = *(double *)
                          (*(long *)&(pIVar1->num_sum).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl +
                          sVar21 * 8), 0x7fefffffffffffff < (ulong)ABS(dVar23))) {
              dVar23 = pdVar5[lVar10];
            }
            else {
              dVar23 = dVar23 / dVar24;
            }
            pdVar18[sVar19 + lVar10 * sVar20] = dVar23;
            sVar21 = sVar21 + 1;
          } while (sVar8 != sVar21);
        }
        sVar8 = pIVar1->n_missing_cat;
        if (sVar8 != 0) {
          lVar22 = *(long *)&(pIVar1->cat_sum).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data;
          lVar9 = *(long *)&(pIVar1->missing_cat).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data;
          piVar11 = (local_68->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          sVar21 = 0;
          do {
            lVar10 = *(long *)(lVar9 + sVar21 * 8);
            pdVar12 = *(double **)(lVar22 + lVar10 * 0x18);
            pdVar13 = *(double **)(lVar22 + 8 + lVar10 * 0x18);
            pdVar18 = pdVar12 + 1;
            pdVar16 = pdVar12;
            if (pdVar18 != pdVar13 && pdVar12 != pdVar13) {
              dVar24 = *pdVar12;
              do {
                dVar23 = *pdVar18;
                pdVar14 = pdVar18;
                if (dVar23 <= dVar24) {
                  dVar23 = dVar24;
                  pdVar14 = pdVar16;
                }
                pdVar16 = pdVar14;
                pdVar18 = pdVar18 + 1;
                dVar24 = dVar23;
              } while (pdVar18 != pdVar13);
            }
            iVar15 = (int)((ulong)((long)pdVar16 - (long)pdVar12) >> 3);
            piVar3[sVar19 + lVar10 * sVar20] = iVar15;
            if ((iVar15 == 0) && (*pdVar12 <= 0.0)) {
              piVar3[sVar19 + lVar10 * sVar20] = piVar11[lVar10];
            }
            sVar21 = sVar21 + 1;
          } while (sVar21 != sVar8);
        }
      }
      sVar19 = sVar19 + 1;
    } while (sVar19 != sVar20);
  }
  return;
}

Assistant:

void apply_imputation_results(imp_arr    &impute_vec,
                              Imputer    &imputer,
                              InputData  &input_data,
                              int        nthreads)
{
    size_t col;

    if (input_data.Xc_indptr != NULL)
    {
        std::vector<size_t> row_pos(input_data.nrows, 0);
        size_t row;

        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            for (auto ix = input_data.Xc_indptr[col]; ix < input_data.Xc_indptr[col + 1]; ix++)
            {
                if (is_na_or_inf(input_data.Xc[ix]))
                {
                    row = input_data.Xc_ind[ix];
                    if (impute_vec[row].sp_num_weight[row_pos[row]] > 0 && !is_na_or_inf(impute_vec[row].sp_num_sum[row_pos[row]]))
                        input_data.Xc[ix]
                            =
                        impute_vec[row].sp_num_sum[row_pos[row]]
                            /
                        impute_vec[row].sp_num_weight[row_pos[row]];
                    else
                        input_data.Xc[ix]
                            =
                        imputer.col_means[col];

                    row_pos[row]++;
                }
            }
        }
    }

    #pragma omp parallel for schedule(dynamic) num_threads(nthreads) shared(input_data, impute_vec, imputer) private(col)
    for (size_t_for row = 0; row < (decltype(row))input_data.nrows; row++)
    {
        if (input_data.has_missing[row])
        {
            for (size_t ix = 0; ix < impute_vec[row].n_missing_num; ix++)
            {
                col = impute_vec[row].missing_num[ix];
                if (impute_vec[row].num_weight[ix] > 0 && !is_na_or_inf(impute_vec[row].num_sum[ix]))
                    input_data.numeric_data[row + col * input_data.nrows]
                        =
                    impute_vec[row].num_sum[ix] / impute_vec[row].num_weight[ix];
                else
                    input_data.numeric_data[row + col * input_data.nrows]
                        =
                    imputer.col_means[col];
            }

            for (size_t ix = 0; ix < impute_vec[row].n_missing_cat; ix++)
            {
                col = impute_vec[row].missing_cat[ix];
                input_data.categ_data[row + col * input_data.nrows]
                    =
                std::distance(impute_vec[row].cat_sum[col].begin(),
                              std::max_element(impute_vec[row].cat_sum[col].begin(),
                                                 impute_vec[row].cat_sum[col].end()));

                if (input_data.categ_data[row + col * input_data.nrows] == 0 && impute_vec[row].cat_sum[col][0] <= 0)
                    input_data.categ_data[row + col * input_data.nrows]
                        =
                    imputer.col_modes[col];
            }
        }
    }
}